

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxerutil.cc
# Opt level: O1

int32 mkvmuxer::GetCodedUIntSize(uint64 value)

{
  int iVar1;
  
  iVar1 = 1;
  if ((((0x7e < value) && (iVar1 = 2, 0x3ffe < value)) && (iVar1 = 3, 0x1ffffe < value)) &&
     (((iVar1 = 4, 0xffffffe < value && (iVar1 = 5, 0x7fffffffe < value)) &&
      (iVar1 = 6, 0x3fffffffffe < value)))) {
    iVar1 = 8 - (uint)(value < 0x1ffffffffffff);
  }
  return iVar1;
}

Assistant:

int32 GetCodedUIntSize(uint64 value) {
  if (value < 0x000000000000007FULL)
    return 1;
  else if (value < 0x0000000000003FFFULL)
    return 2;
  else if (value < 0x00000000001FFFFFULL)
    return 3;
  else if (value < 0x000000000FFFFFFFULL)
    return 4;
  else if (value < 0x00000007FFFFFFFFULL)
    return 5;
  else if (value < 0x000003FFFFFFFFFFULL)
    return 6;
  else if (value < 0x0001FFFFFFFFFFFFULL)
    return 7;
  return 8;
}